

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O0

int __thiscall ser::OffsetTable::GetSavepointID(OffsetTable *this,Savepoint *savepoint)

{
  bool bVar1;
  pointer ppVar2;
  int local_34;
  _Self local_28;
  _Self local_20;
  const_iterator iter;
  Savepoint *savepoint_local;
  OffsetTable *this_local;
  
  iter._M_node = (_Base_ptr)savepoint;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<ser::Savepoint,_int,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
       ::find(&this->savepointIndex_,savepoint);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<ser::Savepoint,_int,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
       ::end(&this->savepointIndex_);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    local_34 = -1;
  }
  else {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_>::operator->
                       (&local_20);
    local_34 = ppVar2->second;
  }
  return local_34;
}

Assistant:

int OffsetTable::GetSavepointID(const Savepoint& savepoint) const
{
    std::map<Savepoint, int>::const_iterator iter = savepointIndex_.find(savepoint);
    return (iter == savepointIndex_.end() ? -1 : iter->second);
}